

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O0

void tp_join(thread_pool_t *tp)

{
  int iVar1;
  int local_14;
  int i;
  thread_pool_t *tp_local;
  
  if ((tp != (thread_pool_t *)0x0) && (tp->threads != (pthread_t *)0x0)) {
    for (local_14 = 0; local_14 < (int)tp->nthread; local_14 = local_14 + 1) {
      iVar1 = pthread_join(tp->threads[local_14],(void **)0x0);
      if (iVar1 != 0) {
        perror("pthread_join() failed");
      }
    }
  }
  return;
}

Assistant:

void tp_join(thread_pool_t *tp)
{
    int i;

    if (tp && tp->threads) {
        for (i = 0; i < (int) tp->nthread; ++i) {
            // todo: check return value
            if (pthread_join(tp->threads[i], NULL)) {
                perror("pthread_join() failed");
            }
        }
    }
}